

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O0

bool __thiscall
Js::DictionaryTypeHandlerBase<int>::TryGetFixedProperty<false,true>
          (DictionaryTypeHandlerBase<int> *this,PropertyRecord *propertyRecord,Var *pProperty,
          FixedPropertyKind propertyType,ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  int index;
  PropertyId propertyId;
  BOOL BVar3;
  RecyclerWeakReference<Js::DynamicObject> **ppRVar4;
  RecyclerWeakReference<Js::DynamicObject> *this_00;
  ScriptContext *pSVar5;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  Var aValue;
  undefined4 *puVar6;
  DynamicObject *local_68;
  Var value;
  DictionaryPropertyDescriptor<int> *pDStack_48;
  int dataSlot;
  DictionaryPropertyDescriptor<int> *descriptor;
  DynamicObject *localSingletonInstance;
  ScriptContext *requestContext_local;
  Var *ppvStack_28;
  FixedPropertyKind propertyType_local;
  Var *pProperty_local;
  PropertyRecord *propertyRecord_local;
  DictionaryTypeHandlerBase<int> *this_local;
  
  localSingletonInstance = (DynamicObject *)requestContext;
  requestContext_local._7_1_ = propertyType;
  ppvStack_28 = pProperty;
  pProperty_local = (Var *)propertyRecord;
  propertyRecord_local = (PropertyRecord *)this;
  ppRVar4 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                      ((WriteBarrierPtr *)&this->singletonInstance);
  if (*ppRVar4 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
    local_68 = (DynamicObject *)0x0;
  }
  else {
    this_00 = Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicObject>_>::operator->
                        (&this->singletonInstance);
    local_68 = Memory::RecyclerWeakReference<Js::DynamicObject>::Get(this_00);
  }
  descriptor = (DictionaryPropertyDescriptor<int> *)local_68;
  if ((local_68 != (DynamicObject *)0x0) &&
     (pSVar5 = RecyclableObject::GetScriptContext(&local_68->super_RecyclableObject),
     pSVar5 == (ScriptContext *)localSingletonInstance)) {
    this_01 = Memory::
              WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
              ::operator->(&this->propertyMap);
    bVar2 = JsUtil::
            BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::TryGetReference<Js::PropertyRecord_const*>
                      ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)this_01,(PropertyRecord **)&pProperty_local,&stack0xffffffffffffffb8);
    if (bVar2) {
      if (((pDStack_48->Attributes & 8) != 0) ||
         (bVar2 = DictionaryPropertyDescriptor<int>::GetIsFixed(pDStack_48), !bVar2)) {
        return false;
      }
      index = DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<false>(pDStack_48);
      if (index != -1) {
        propertyId = PropertyRecord::GetPropertyId((PropertyRecord *)pProperty_local);
        BVar3 = IsInternalPropertyId(propertyId);
        if (BVar3 != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                      ,0xa23,
                                      "(!IsInternalPropertyId(propertyRecord->GetPropertyId()))",
                                      "!IsInternalPropertyId(propertyRecord->GetPropertyId())");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        aValue = DynamicObject::GetSlot((DynamicObject *)descriptor,index);
        if ((aValue != (Var)0x0) &&
           (((bVar2 = DynamicTypeHandler::IsFixedMethodProperty
                                (&this->super_DynamicTypeHandler,requestContext_local._7_1_), bVar2
             && (bVar2 = VarIs<Js::JavascriptFunction>(aValue), bVar2)) ||
            (bVar2 = DynamicTypeHandler::IsFixedDataProperty
                               (&this->super_DynamicTypeHandler,requestContext_local._7_1_), bVar2))
           )) {
          *ppvStack_28 = aValue;
          DictionaryPropertyDescriptor<int>::SetUsedAsFixed(pDStack_48,true);
          return true;
        }
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0xa32,"(allowNonExistent)",
                                  "Trying to get a fixed function instance for a non-existent property?"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
  }
  return false;
}

Assistant:

bool DictionaryTypeHandlerBase<T>::TryGetFixedProperty(PropertyRecord const * propertyRecord, Var * pProperty, FixedPropertyKind propertyType, ScriptContext * requestContext)
    {
        // Note: This function is not thread-safe and cannot be called from the JIT thread.  That's why we collect and
        // cache any fixed function instances during work item creation on the main thread.
        DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
        if (localSingletonInstance != nullptr && localSingletonInstance->GetScriptContext() == requestContext)
        {
            DictionaryPropertyDescriptor<T>* descriptor;
            if (propertyMap->TryGetReference(propertyRecord, &descriptor))
            {
                if (descriptor->Attributes & PropertyDeleted || !descriptor->GetIsFixed())
                {
                    return false;
                }
                T dataSlot = descriptor->template GetDataPropertyIndex<false>();
                if (dataSlot != NoSlots)
                {
                    Assert(!IsInternalPropertyId(propertyRecord->GetPropertyId()));
                    Var value = localSingletonInstance->GetSlot(dataSlot);
                    if (value && ((IsFixedMethodProperty(propertyType) && VarIs<JavascriptFunction>(value)) || IsFixedDataProperty(propertyType)))
                    {
                        *pProperty = value;
                        if (markAsUsed)
                        {
                            descriptor->SetUsedAsFixed(true);
                        }
                        return true;
                    }
                }
            }
            else
            {
                AssertMsg(allowNonExistent, "Trying to get a fixed function instance for a non-existent property?");
            }
        }

        return false;
    }